

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O0

bool spvtools::anon_unknown_6::startsWithOp(spv_text text,spv_position position)

{
  bool local_25;
  bool local_24;
  char ch2;
  char ch1;
  char ch0;
  spv_position position_local;
  spv_text text_local;
  
  if (text->length < position->index + 3) {
    text_local._7_1_ = false;
  }
  else {
    local_24 = false;
    if ((text->str[position->index] == 'O') &&
       (local_24 = false, text->str[position->index + 1] == 'p')) {
      local_25 = '@' < text->str[position->index + 2] && text->str[position->index + 2] < '[';
      local_24 = local_25;
    }
    text_local._7_1_ = local_24;
  }
  return text_local._7_1_;
}

Assistant:

bool startsWithOp(spv_text text, spv_position position) {
  if (text->length < position->index + 3) return false;
  char ch0 = text->str[position->index];
  char ch1 = text->str[position->index + 1];
  char ch2 = text->str[position->index + 2];
  return ('O' == ch0 && 'p' == ch1 && ('A' <= ch2 && ch2 <= 'Z'));
}